

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O2

Abc_Obj_t * Abc_SclFindCriticalCo(SC_Man *p,int *pfRise)

{
  float fVar1;
  uint uVar2;
  SC_Pair *pSVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  Abc_Ntk_t *pNtk;
  char *__assertion;
  int i;
  float fVar6;
  
  pNtk = p->pNtk;
  if (pNtk->vPos->nSize < 1) {
    __assertion = "Abc_NtkPoNum(p->pNtk) > 0";
    uVar2 = 0x39;
  }
  else {
    fVar6 = 0.0;
    pAVar5 = (Abc_Obj_t *)0x0;
    for (i = 0; i < pNtk->vCos->nSize; i = i + 1) {
      pAVar4 = Abc_NtkCo(pNtk,i);
      pSVar3 = p->pTimes;
      uVar2 = pAVar4->Id;
      fVar1 = pSVar3[uVar2].rise;
      if (fVar6 < fVar1) {
        *pfRise = 1;
        pAVar5 = pAVar4;
        fVar6 = fVar1;
      }
      fVar1 = pSVar3[uVar2].fall;
      if (fVar6 < fVar1) {
        *pfRise = 0;
        pAVar5 = pAVar4;
        fVar6 = fVar1;
      }
      pNtk = p->pNtk;
    }
    if ((fVar6 == 0.0) && (!NAN(fVar6))) {
      pAVar5 = Abc_NtkPo(pNtk,0);
    }
    if (pAVar5 != (Abc_Obj_t *)0x0) {
      return pAVar5;
    }
    __assertion = "pPivot != NULL";
    uVar2 = 0x42;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclSize.c"
                ,uVar2,"Abc_Obj_t *Abc_SclFindCriticalCo(SC_Man *, int *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Finding most critical objects.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Abc_Obj_t * Abc_SclFindCriticalCo( SC_Man * p, int * pfRise )
{
    Abc_Obj_t * pObj, * pPivot = NULL;
    float fMaxArr = 0;
    int i;
    assert( Abc_NtkPoNum(p->pNtk) > 0 );
    Abc_NtkForEachCo( p->pNtk, pObj, i )
    {
        SC_Pair * pArr = Abc_SclObjTime( p, pObj );
        if ( fMaxArr < pArr->rise )  fMaxArr = pArr->rise, *pfRise = 1, pPivot = pObj;
        if ( fMaxArr < pArr->fall )  fMaxArr = pArr->fall, *pfRise = 0, pPivot = pObj;
    }
    if ( fMaxArr == 0 )
        pPivot = Abc_NtkPo(p->pNtk, 0);
    assert( pPivot != NULL );
    return pPivot;
}